

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O0

int Io_WriteAigerEncode(uchar *pBuffer,int Pos,uint x)

{
  uint local_18;
  int iStack_14;
  uchar ch;
  uint x_local;
  int Pos_local;
  uchar *pBuffer_local;
  
  iStack_14 = Pos;
  for (local_18 = x; (local_18 & 0xffffff80) != 0; local_18 = local_18 >> 7) {
    pBuffer[iStack_14] = (byte)local_18 & 0x7f | 0x80;
    iStack_14 = iStack_14 + 1;
  }
  pBuffer[iStack_14] = (byte)local_18;
  return iStack_14 + 1;
}

Assistant:

int Io_WriteAigerEncode( unsigned char * pBuffer, int Pos, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
//        putc (ch, file);
        pBuffer[Pos++] = ch;
        x >>= 7;
    }
    ch = x;
//    putc (ch, file);
    pBuffer[Pos++] = ch;
    return Pos;
}